

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

StatementBlockSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::StatementBlockSymbol,slang::ast::Compilation&,char_const(&)[1],slang::SourceLocation&,slang::ast::StatementBlockKind,slang::ast::VariableLifetime>
          (BumpAllocator *this,Compilation *args,char (*args_1) [1],SourceLocation *args_2,
          StatementBlockKind *args_3,VariableLifetime *args_4)

{
  StatementBlockSymbol *this_00;
  size_t sVar1;
  string_view name;
  
  this_00 = (StatementBlockSymbol *)allocate(this,0x98,8);
  sVar1 = strlen(*args_1);
  name._M_str = *args_1;
  name._M_len = sVar1;
  ast::StatementBlockSymbol::StatementBlockSymbol(this_00,args,name,*args_2,*args_3,*args_4);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }